

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmListFileBacktrace * __thiscall
cmMakefile::GetBacktrace
          (cmListFileBacktrace *__return_storage_ptr__,cmMakefile *this,cmCommandContext *cc)

{
  cmListFileContext lfc;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  string local_48;
  
  local_90._8_8_ = 0;
  local_90[0x10] = '\0';
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = 0;
  local_90._0_8_ = local_90 + 0x10;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_assign((string *)local_90);
  local_50 = cc->Line;
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_48,&this->StateSnapshot);
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  cmListFileBacktrace::Push(__return_storage_ptr__,&this->Backtrace,(cmListFileContext *)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,CONCAT71(local_90._17_7_,local_90[0x10]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace(cmCommandContext const& cc) const
{
  cmListFileContext lfc;
  lfc.Name = cc.Name;
  lfc.Line = cc.Line;
  lfc.FilePath = this->StateSnapshot.GetExecutionListFile();
  return this->Backtrace.Push(lfc);
}